

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void rtc_set_updates_ref_frame_config
               (ExtRefreshFrameFlagsInfo *ext_refresh_frame_flags,RTC_REF *rtc_ref)

{
  int i;
  RTC_REF *rtc_ref_local;
  ExtRefreshFrameFlagsInfo *ext_refresh_frame_flags_local;
  
  ext_refresh_frame_flags->update_pending = true;
  ext_refresh_frame_flags->last_frame = rtc_ref->refresh[rtc_ref->ref_idx[0]] != 0;
  ext_refresh_frame_flags->golden_frame = rtc_ref->refresh[rtc_ref->ref_idx[3]] != 0;
  ext_refresh_frame_flags->bwd_ref_frame = rtc_ref->refresh[rtc_ref->ref_idx[4]] != 0;
  ext_refresh_frame_flags->alt2_ref_frame = rtc_ref->refresh[rtc_ref->ref_idx[5]] != 0;
  ext_refresh_frame_flags->alt_ref_frame = rtc_ref->refresh[rtc_ref->ref_idx[6]] != 0;
  rtc_ref->non_reference_frame = 1;
  i = 0;
  while( true ) {
    if (7 < i) {
      return;
    }
    if (rtc_ref->refresh[i] == 1) break;
    i = i + 1;
  }
  rtc_ref->non_reference_frame = 0;
  return;
}

Assistant:

static void rtc_set_updates_ref_frame_config(
    ExtRefreshFrameFlagsInfo *const ext_refresh_frame_flags,
    RTC_REF *const rtc_ref) {
  ext_refresh_frame_flags->update_pending = 1;
  ext_refresh_frame_flags->last_frame = rtc_ref->refresh[rtc_ref->ref_idx[0]];
  ext_refresh_frame_flags->golden_frame = rtc_ref->refresh[rtc_ref->ref_idx[3]];
  ext_refresh_frame_flags->bwd_ref_frame =
      rtc_ref->refresh[rtc_ref->ref_idx[4]];
  ext_refresh_frame_flags->alt2_ref_frame =
      rtc_ref->refresh[rtc_ref->ref_idx[5]];
  ext_refresh_frame_flags->alt_ref_frame =
      rtc_ref->refresh[rtc_ref->ref_idx[6]];
  rtc_ref->non_reference_frame = 1;
  for (int i = 0; i < REF_FRAMES; i++) {
    if (rtc_ref->refresh[i] == 1) {
      rtc_ref->non_reference_frame = 0;
      break;
    }
  }
}